

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O0

void write_command_type(Context *ctx,CommandType type,Var cmdObj)

{
  WabtAPIError *this;
  uint i;
  Var cmdObj_local;
  CommandType type_local;
  Context *ctx_local;
  
  if (AssertExhaustion < type) {
    this = (WabtAPIError *)__cxa_allocate_exception(8);
    ChakraWabt::WabtAPIError::WabtAPIError(this,"invalid command type");
    __cxa_throw(this,&ChakraWabt::WabtAPIError::typeinfo,0);
  }
  write_string(ctx,cmdObj,0xb,write_command_type::s_command_names[type],0xffffffff);
  return;
}

Assistant:

void write_command_type(Context* ctx, CommandType type, Js::Var cmdObj)
{
    static const char* s_command_names[] = {
        "module",
        "action",
        "register",
        "assert_malformed",
        "assert_invalid",
        "assert_unlinkable",
        "assert_uninstantiable",
        "assert_return",
        "assert_return_canonical_nan",
        "assert_return_arithmetic_nan",
        "assert_trap",
        "assert_exhaustion",
    };
    WABT_STATIC_ASSERT(sizeof(s_command_names) / sizeof(char*) == (int)CommandType::Last + 1);
    uint i = (uint)type;
    if (i > (uint)CommandType::Last)
    {
        throw WabtAPIError("invalid command type");
    }
    write_string(ctx, cmdObj, PropertyIds::type, s_command_names[i]);
}